

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O1

int io_file_iter(lua_State *L)

{
  IOFileUD *iof;
  TValue *pTVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  pTVar1 = L->base;
  uVar4 = pTVar1[-2].u64 & 0x7fffffffffff;
  uVar6 = *(ulong *)(uVar4 + 0x30) & 0x7fffffffffff;
  if (*(long *)(uVar6 + 0x30) == 0) {
    lj_err_caller(L,LJ_ERR_IOCLFL);
  }
  iof = (IOFileUD *)(uVar6 + 0x30);
  uVar5 = (ulong)*(byte *)(uVar4 + 0xb) - 1;
  L->top = pTVar1;
  if ((MSize)uVar5 != 0) {
    if ((long)((L->maxstack).ptr64 - (long)pTVar1) <= (long)((uVar5 & 0xffffffff) * 8)) {
      lj_state_growstack(L,(MSize)uVar5);
    }
    memcpy(L->top,(void *)(uVar4 + 0x38),uVar5 * 8);
    L->top = L->top + uVar5;
  }
  iVar2 = io_file_read(L,iof,0);
  iVar3 = ferror((FILE *)iof->fp);
  if (iVar3 == 0) {
    if ((L->base->u64 == 0xffffffffffffffff) && ((*(byte *)(uVar6 + 0x38) & 4) != 0)) {
      io_file_close(L,iof);
      iVar2 = 0;
    }
    return iVar2;
  }
  lj_err_callermsg(L,(char *)((L->top[-2].u64 & 0x7fffffffffff) + 0x18));
}

Assistant:

static int io_file_iter(lua_State *L)
{
  GCfunc *fn = curr_func(L);
  IOFileUD *iof = uddata(udataV(&fn->c.upvalue[0]));
  int n = fn->c.nupvalues - 1;
  if (iof->fp == NULL)
    lj_err_caller(L, LJ_ERR_IOCLFL);
  L->top = L->base;
  if (n) {  /* Copy upvalues with options to stack. */
    lj_state_checkstack(L, (MSize)n);
    memcpy(L->top, &fn->c.upvalue[1], n*sizeof(TValue));
    L->top += n;
  }
  n = io_file_read(L, iof, 0);
  if (ferror(iof->fp))
    lj_err_callermsg(L, strVdata(L->top-2));
  if (tvisnil(L->base) && (iof->type & IOFILE_FLAG_CLOSE)) {
    io_file_close(L, iof);  /* Return values are ignored. */
    return 0;
  }
  return n;
}